

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::ComputeCirclePoints
               (double xc,double yc,double r,double *px,double *py,int *noPoints)

{
  double dVar1;
  double dVar2;
  int y;
  int x;
  int count;
  int prevY;
  int prevX;
  double angle;
  double angleInc;
  int len;
  int *noPoints_local;
  double *py_local;
  double *px_local;
  double r_local;
  double yc_local;
  double xc_local;
  
  _prevY = 0.0;
  y = 0;
  while (_prevY < 6.283185307179586) {
    dVar1 = cos(_prevY);
    dVar2 = sin(_prevY);
    _prevY = 6.283185307179586 / (double)(int)(r * 6.283185307179586 + 0.5) + _prevY;
    px[y] = (double)(int)(dVar1 * r + xc + 0.5);
    py[y] = (double)(int)(dVar2 * r + yc + 0.5);
    y = y + 1;
  }
  *noPoints = y;
  return;
}

Assistant:

void EDCircles::ComputeCirclePoints(double xc, double yc, double r, double * px, double * py, int * noPoints)
{
	int len = (int)(TWOPI*r + 0.5);
	double angleInc = TWOPI / len;
	double angle = 0;

	int prevX = -1;
	int prevY = -1;
	int count = 0;

	while (angle < TWOPI) {
		int x = (int)(cos(angle)*r + xc + 0.5);
		int y = (int)(sin(angle)*r + yc + 0.5);

		angle += angleInc;

		px[count] = x;
		py[count] = y;
		count++;
	} //end-while

	*noPoints = count;
}